

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtVector3.h
# Opt level: O2

cbtVector3 * __thiscall cbtVector3::safeNormalize(cbtVector3 *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [64];
  float local_c;
  undefined1 extraout_var [60];
  
  auVar2._0_4_ = length2(this);
  auVar2._4_60_ = extraout_var;
  if (1.4210855e-14 <= auVar2._0_4_) {
    if (auVar2._0_4_ < 0.0) {
      local_c = sqrtf(auVar2._0_4_);
    }
    else {
      auVar1 = vsqrtss_avx(auVar2._0_16_,auVar2._0_16_);
      local_c = auVar1._0_4_;
    }
    operator/=(this,&local_c);
  }
  else {
    *(undefined1 (*) [16])this->m_floats = SUB6416(ZEXT464(0x3f800000),0);
  }
  return this;
}

Assistant:

SIMD_FORCE_INLINE cbtVector3& safeNormalize()
	{
		cbtScalar l2 = length2();
		//triNormal.normalize();
		if (l2 >= SIMD_EPSILON * SIMD_EPSILON)
		{
			(*this) /= cbtSqrt(l2);
		}
		else
		{
			setValue(1, 0, 0);
		}
		return *this;
	}